

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O3

void uv__inotify_read(uv_loop_t *loop,uv__io_t *dummy,uint events)

{
  void **ppvVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  long **pplVar6;
  QUEUE *q;
  ssize_t sVar7;
  char *pcVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  watcher_list *w;
  QUEUE queue;
  char buf [4096];
  long *local_1058;
  undefined1 *local_1050;
  uv_loop_t *local_1048;
  int *local_1040;
  int local_1038 [1026];
  
  local_1048 = loop;
  do {
    while (sVar7 = read(loop->inotify_fd,local_1038,0x1000), sVar7 == -1) {
      piVar9 = __errno_location();
      if (*piVar9 != 4) {
        if (*piVar9 != 0xb) {
          __assert_fail("errno == EAGAIN || errno == EWOULDBLOCK",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/linux-inotify.c"
                        ,0xbb,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
        }
        return;
      }
    }
    if (sVar7 < 1) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/linux-inotify.c"
                    ,0xbf,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    piVar10 = (int *)((long)local_1038 + sVar7);
    piVar9 = local_1038;
    local_1040 = piVar10;
    do {
      uVar2 = piVar9[1];
      w = (watcher_list *)loop->inotify_watchers;
      if (w != (watcher_list *)0x0) {
LAB_007103f9:
        if (*piVar9 < w->wd) goto LAB_00710405;
        if (w->wd < *piVar9) {
          w = (watcher_list *)&(w->entry).rbe_right;
          goto LAB_00710405;
        }
        if (piVar9[3] == 0) {
          piVar10 = (int *)w->path;
          pcVar8 = strrchr((char *)piVar10,0x2f);
          piVar11 = (int *)(pcVar8 + 1);
          if (pcVar8 == (char *)0x0) {
            piVar11 = piVar10;
          }
        }
        else {
          piVar11 = piVar9 + 4;
        }
        w->iterating = 1;
        ppvVar1 = w->watchers;
        local_1058 = (long *)w->watchers[0];
        pplVar6 = &local_1058;
        local_1050 = (undefined1 *)&local_1058;
        if (ppvVar1 != (void **)local_1058) {
          local_1050 = (undefined1 *)w->watchers[1];
          *(long ***)local_1050 = &local_1058;
          plVar3 = (long *)local_1058[1];
          w->watchers[1] = plVar3;
          *plVar3 = (long)ppvVar1;
          local_1058[1] = (long)&local_1058;
          while (pplVar6 = (long **)local_1058, &local_1058 != (long **)local_1058) {
            lVar4 = *local_1058;
            *(long *)local_1058[1] = lVar4;
            *(long *)(lVar4 + 8) = local_1058[1];
            *local_1058 = (long)ppvVar1;
            puVar5 = (undefined8 *)w->watchers[1];
            local_1058[1] = (long)puVar5;
            *puVar5 = local_1058;
            w->watchers[1] = local_1058;
            (*(code *)local_1058[-1])
                      (local_1058 + -0xe,piVar11,
                       ((uVar2 & 0xfffffff9) != 0) + ((uVar2 & 6) != 0) * '\x02',0);
          }
        }
        local_1058 = (long *)pplVar6;
        loop = local_1048;
        w->iterating = 0;
        maybe_free_watcher_list(w,local_1048);
        piVar10 = local_1040;
      }
LAB_007104d1:
      piVar9 = (int *)((long)piVar9 + (ulong)(uint)piVar9[3] + 0x10);
    } while (piVar9 < piVar10);
  } while( true );
LAB_00710405:
  w = (w->entry).rbe_left;
  if (w == (watcher_list *)0x0) goto LAB_007104d1;
  goto LAB_007103f9;
}

Assistant:

static void uv__inotify_read(uv_loop_t* loop,
                             uv__io_t* dummy,
                             unsigned int events) {
  const struct inotify_event* e;
  struct watcher_list* w;
  uv_fs_event_t* h;
  QUEUE queue;
  QUEUE* q;
  const char* path;
  ssize_t size;
  const char *p;
  /* needs to be large enough for sizeof(inotify_event) + strlen(path) */
  char buf[4096];

  for (;;) {
    do
      size = read(loop->inotify_fd, buf, sizeof(buf));
    while (size == -1 && errno == EINTR);

    if (size == -1) {
      assert(errno == EAGAIN || errno == EWOULDBLOCK);
      break;
    }

    assert(size > 0); /* pre-2.6.21 thing, size=0 == read buffer too small */

    /* Now we have one or more inotify_event structs. */
    for (p = buf; p < buf + size; p += sizeof(*e) + e->len) {
      e = (const struct inotify_event*) p;

      events = 0;
      if (e->mask & (IN_ATTRIB|IN_MODIFY))
        events |= UV_CHANGE;
      if (e->mask & ~(IN_ATTRIB|IN_MODIFY))
        events |= UV_RENAME;

      w = find_watcher(loop, e->wd);
      if (w == NULL)
        continue; /* Stale event, no watchers left. */

      /* inotify does not return the filename when monitoring a single file
       * for modifications. Repurpose the filename for API compatibility.
       * I'm not convinced this is a good thing, maybe it should go.
       */
      path = e->len ? (const char*) (e + 1) : uv__basename_r(w->path);

      /* We're about to iterate over the queue and call user's callbacks.
       * What can go wrong?
       * A callback could call uv_fs_event_stop()
       * and the queue can change under our feet.
       * So, we use QUEUE_MOVE() trick to safely iterate over the queue.
       * And we don't free the watcher_list until we're done iterating.
       *
       * First,
       * tell uv_fs_event_stop() (that could be called from a user's callback)
       * not to free watcher_list.
       */
      w->iterating = 1;
      QUEUE_MOVE(&w->watchers, &queue);
      while (!QUEUE_EMPTY(&queue)) {
        q = QUEUE_HEAD(&queue);
        h = QUEUE_DATA(q, uv_fs_event_t, watchers);

        QUEUE_REMOVE(q);
        QUEUE_INSERT_TAIL(&w->watchers, q);

        h->cb(h, path, events, 0);
      }
      /* done iterating, time to (maybe) free empty watcher_list */
      w->iterating = 0;
      maybe_free_watcher_list(w, loop);
    }
  }
}